

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O3

void __thiscall
FMultiPatchTexture::FMultiPatchTexture(FMultiPatchTexture *this,FScanner *sc,int usetype)

{
  undefined1 *puVar1;
  FString *this_00;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  TexInit *pTVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  uint uVar8;
  TexInit *pTVar9;
  bool bVar10;
  TexPart *pTVar11;
  ulong *puVar12;
  FScanner *pFVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  undefined4 uVar17;
  undefined8 unaff_R13;
  ulong uVar18;
  long lVar19;
  TexInit init;
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> parts;
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> inits;
  TexInit local_b8;
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> local_98;
  undefined4 local_84;
  FScriptPosition local_80;
  TexPart local_70;
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> local_48;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FMultiPatchTexture_0070a160;
  this->Parts = (TexPart *)0x0;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->field_0x80 = this->field_0x80 & 0xfc;
  local_98.Array = (TexPart *)0x0;
  local_98.Most = 0;
  local_98.Count = 0;
  local_48.Array = (TexInit *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  puVar1 = &(this->super_FTexture).field_0x32;
  *puVar1 = *puVar1 | 2;
  FScanner::SetCMode(sc,true);
  FScanner::MustGetString(sc);
  pcVar16 = "optional";
  bVar10 = FScanner::Compare(sc,"optional");
  if (bVar10) {
    FScanner::MustGetString(sc);
    bVar10 = FScanner::Compare(sc,",");
    uVar17 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    if (bVar10) {
      FScanner::UnGet(sc);
      uVar17 = 0;
      goto LAB_004fba47;
    }
  }
  else {
    uVar17 = 0;
  }
  pcVar16 = sc->String;
LAB_004fba47:
  this_00 = &(this->super_FTexture).Name;
  FString::operator=(this_00,pcVar16);
  FString::ToUpper(this_00);
  FScanner::MustGetStringName(sc,",");
  FScanner::MustGetNumber(sc);
  (this->super_FTexture).Width = (WORD)sc->Number;
  FScanner::MustGetStringName(sc,",");
  FScanner::MustGetNumber(sc);
  (this->super_FTexture).Height = (WORD)sc->Number;
  (this->super_FTexture).UseType = (BYTE)usetype;
  bVar10 = FScanner::CheckString(sc,"{");
  if (bVar10) {
    while (local_84 = uVar17, bVar10 = FScanner::CheckString(sc,"}"), uVar7 = local_98._8_8_,
          !bVar10) {
      FScanner::MustGetString(sc);
      bVar10 = FScanner::Compare(sc,"XScale");
      if (bVar10) {
        FScanner::MustGetFloat(sc);
        dVar2 = sc->Float;
        (this->super_FTexture).Scale.X = dVar2;
        pcVar16 = "Texture %s is defined with null x-scale\n";
LAB_004fbb60:
        uVar17 = local_84;
        if ((dVar2 == 0.0) && (pFVar13 = (FScanner *)this_00, !NAN(dVar2))) {
LAB_004fbb6c:
          FScanner::ScriptError(sc,pcVar16,pFVar13->String);
          uVar17 = local_84;
        }
      }
      else {
        bVar10 = FScanner::Compare(sc,"YScale");
        if (bVar10) {
          FScanner::MustGetFloat(sc);
          dVar2 = sc->Float;
          (this->super_FTexture).Scale.Y = dVar2;
          pcVar16 = "Texture %s is defined with null y-scale\n";
          goto LAB_004fbb60;
        }
        bVar10 = FScanner::Compare(sc,"WorldPanning");
        if (bVar10) {
          puVar1 = &(this->super_FTexture).field_0x31;
          *puVar1 = *puVar1 | 4;
          uVar17 = local_84;
        }
        else {
          bVar10 = FScanner::Compare(sc,"NullTexture");
          if (bVar10) {
            (this->super_FTexture).UseType = '\r';
            uVar17 = local_84;
          }
          else {
            bVar10 = FScanner::Compare(sc,"NoDecals");
            if (bVar10) {
              puVar1 = &(this->super_FTexture).field_0x31;
              *puVar1 = *puVar1 | 1;
              uVar17 = local_84;
            }
            else {
              bVar10 = FScanner::Compare(sc,"Patch");
              if (bVar10) {
                local_70.OriginX = 0;
                local_70.OriginY = 0;
                local_70.Rotate = '\0';
                local_70.op = '\0';
                local_70.Texture = (FTexture *)0x0;
                local_70.Translation = (FRemapTable *)0x0;
                local_70.Blend.field_0.d = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
                local_70.Alpha = 0x10000;
                local_b8.TexName.Chars = FString::NullString.Nothing;
                local_b8.UseType = 0xd;
                local_b8.Silent = false;
                local_b8.HasLine = false;
                local_b8.UseOffsets = false;
                local_b8.sc.FileName.Chars = FString::NullString.Nothing;
                FString::NullString.RefCount = FString::NullString.RefCount + 2;
                local_b8.sc.ScriptLine = 0;
                ParsePatch(this,sc,&local_70,&local_b8);
                if (((FNullStringData *)(local_b8.TexName.Chars + -0xc))->Len != 0) {
                  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Grow
                            (&local_98,1);
                  uVar14 = (ulong)local_98.Count;
                  *(ulong *)&local_98.Array[uVar14].Alpha = CONCAT44(local_70._36_4_,local_70.Alpha)
                  ;
                  *(ulong *)&local_98.Array[uVar14].Blend =
                       CONCAT44(local_70._20_4_,local_70.Blend.field_0.d);
                  *(FTexture **)(&local_98.Array[uVar14].Blend + 2) = local_70.Texture;
                  pTVar11 = local_98.Array + uVar14;
                  pTVar11->OriginX = local_70.OriginX;
                  pTVar11->OriginY = local_70.OriginY;
                  pTVar11->Rotate = local_70.Rotate;
                  pTVar11->op = local_70.op;
                  *(undefined2 *)&pTVar11->field_0x6 = local_70._6_2_;
                  pTVar11->Translation = local_70.Translation;
                  local_98.Count = local_98.Count + 1;
                  local_b8.UseType = 4;
                  local_b8.HasLine = true;
                  local_b8.Silent = SUB41(local_84,0);
                  FScriptPosition::FScriptPosition(&local_80,sc);
                  FScriptPosition::operator=(&local_b8.sc,&local_80);
                  FString::~FString(&local_80.FileName);
                  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                            (&local_48,&local_b8);
                }
LAB_004fbf03:
                FString::~FString(&local_b8.sc.FileName);
                FString::~FString(&local_b8.TexName);
                uVar17 = local_84;
              }
              else {
                bVar10 = FScanner::Compare(sc,"Sprite");
                if (bVar10) {
                  local_70.OriginX = 0;
                  local_70.OriginY = 0;
                  local_70.Rotate = '\0';
                  local_70.op = '\0';
                  local_70.Texture = (FTexture *)0x0;
                  local_70.Translation = (FRemapTable *)0x0;
                  local_70.Blend.field_0.d = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
                  local_70.Alpha = 0x10000;
                  local_b8.TexName.Chars = FString::NullString.Nothing;
                  local_b8.UseType = 0xd;
                  local_b8.Silent = false;
                  local_b8.HasLine = false;
                  local_b8.UseOffsets = false;
                  local_b8.sc.FileName.Chars = FString::NullString.Nothing;
                  FString::NullString.RefCount = FString::NullString.RefCount + 2;
                  local_b8.sc.ScriptLine = 0;
                  ParsePatch(this,sc,&local_70,&local_b8);
                  if (((FNullStringData *)(local_b8.TexName.Chars + -0xc))->Len != 0) {
                    TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Grow
                              (&local_98,1);
                    uVar14 = (ulong)local_98.Count;
                    *(ulong *)&local_98.Array[uVar14].Alpha =
                         CONCAT44(local_70._36_4_,local_70.Alpha);
                    *(ulong *)&local_98.Array[uVar14].Blend =
                         CONCAT44(local_70._20_4_,local_70.Blend.field_0.d);
                    *(FTexture **)(&local_98.Array[uVar14].Blend + 2) = local_70.Texture;
                    pTVar11 = local_98.Array + uVar14;
                    pTVar11->OriginX = local_70.OriginX;
                    pTVar11->OriginY = local_70.OriginY;
                    pTVar11->Rotate = local_70.Rotate;
                    pTVar11->op = local_70.op;
                    *(undefined2 *)&pTVar11->field_0x6 = local_70._6_2_;
                    pTVar11->Translation = local_70.Translation;
                    local_98.Count = local_98.Count + 1;
                    local_b8.UseType = 3;
                    local_b8.HasLine = true;
                    local_b8.Silent = SUB41(local_84,0);
                    FScriptPosition::FScriptPosition(&local_80,sc);
                    FScriptPosition::operator=(&local_b8.sc,&local_80);
                    FString::~FString(&local_80.FileName);
                    TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                              (&local_48,&local_b8);
                  }
                  goto LAB_004fbf03;
                }
                bVar10 = FScanner::Compare(sc,"Graphic");
                if (bVar10) {
                  local_70.OriginX = 0;
                  local_70.OriginY = 0;
                  local_70.Rotate = '\0';
                  local_70.op = '\0';
                  local_70.Texture = (FTexture *)0x0;
                  local_70.Translation = (FRemapTable *)0x0;
                  local_70.Blend.field_0.d = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
                  local_70.Alpha = 0x10000;
                  local_b8.TexName.Chars = FString::NullString.Nothing;
                  local_b8.UseType = 0xd;
                  local_b8.Silent = false;
                  local_b8.HasLine = false;
                  local_b8.UseOffsets = false;
                  local_b8.sc.FileName.Chars = FString::NullString.Nothing;
                  FString::NullString.RefCount = FString::NullString.RefCount + 2;
                  local_b8.sc.ScriptLine = 0;
                  ParsePatch(this,sc,&local_70,&local_b8);
                  if (((FNullStringData *)(local_b8.TexName.Chars + -0xc))->Len != 0) {
                    TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Grow
                              (&local_98,1);
                    uVar14 = (ulong)local_98.Count;
                    *(ulong *)&local_98.Array[uVar14].Alpha =
                         CONCAT44(local_70._36_4_,local_70.Alpha);
                    *(ulong *)&local_98.Array[uVar14].Blend =
                         CONCAT44(local_70._20_4_,local_70.Blend.field_0.d);
                    *(FTexture **)(&local_98.Array[uVar14].Blend + 2) = local_70.Texture;
                    pTVar11 = local_98.Array + uVar14;
                    pTVar11->OriginX = local_70.OriginX;
                    pTVar11->OriginY = local_70.OriginY;
                    pTVar11->Rotate = local_70.Rotate;
                    pTVar11->op = local_70.op;
                    *(undefined2 *)&pTVar11->field_0x6 = local_70._6_2_;
                    pTVar11->Translation = local_70.Translation;
                    local_98.Count = local_98.Count + 1;
                    local_b8.UseType = 8;
                    local_b8.HasLine = true;
                    local_b8.Silent = SUB41(local_84,0);
                    FScriptPosition::FScriptPosition(&local_80,sc);
                    FScriptPosition::operator=(&local_b8.sc,&local_80);
                    FString::~FString(&local_80.FileName);
                    TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                              (&local_48,&local_b8);
                  }
                  goto LAB_004fbf03;
                }
                bVar10 = FScanner::Compare(sc,"Offset");
                pcVar16 = "Unknown texture property \'%s\'";
                pFVar13 = sc;
                if (!bVar10) goto LAB_004fbb6c;
                FScanner::MustGetNumber(sc);
                (this->super_FTexture).LeftOffset = (SWORD)sc->Number;
                FScanner::MustGetStringName(sc,",");
                FScanner::MustGetNumber(sc);
                (this->super_FTexture).TopOffset = (SWORD)sc->Number;
                uVar17 = local_84;
              }
            }
          }
        }
      }
    }
    uVar8 = local_98.Count;
    uVar18 = (ulong)(int)local_98.Count;
    this->NumParts = local_98.Count;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar18;
    uVar14 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x28),8) == 0) {
      uVar14 = SUB168(auVar6 * ZEXT816(0x28),0);
    }
    pTVar11 = (TexPart *)operator_new__(uVar14);
    if (uVar8 != 0) {
      lVar15 = 0;
      do {
        *(undefined4 *)((long)&pTVar11->OriginX + lVar15) = 0;
        *(undefined2 *)(&pTVar11->Rotate + lVar15) = 0;
        *(undefined8 *)((long)&pTVar11->Texture + lVar15) = 0;
        *(undefined8 *)((long)&pTVar11->Translation + lVar15) = 0;
        *(undefined4 *)((long)&(pTVar11->Blend).field_0 + lVar15) = 0;
        *(undefined4 *)((long)&pTVar11->Alpha + lVar15) = 0x10000;
        lVar15 = lVar15 + 0x28;
      } while (uVar18 * 0x28 != lVar15);
    }
    this->Parts = pTVar11;
    memcpy(pTVar11,local_98.Array,uVar18 * 0x28);
    uVar14 = 0xffffffffffffffff;
    if (-1 < (long)uVar7) {
      uVar14 = uVar18 * 0x20 + 8;
    }
    puVar12 = (ulong *)operator_new__(uVar14);
    *puVar12 = uVar18;
    if (uVar8 == 0) {
      this->Inits = (TexInit *)(puVar12 + 1);
    }
    else {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)puVar12 + lVar15 + 8) = 0x723dac;
        *(undefined4 *)((long)puVar12 + lVar15 + 0x10) = 0xd;
        *(undefined2 *)((long)puVar12 + lVar15 + 0x14) = 0;
        *(undefined1 *)((long)puVar12 + lVar15 + 0x16) = 0;
        *(undefined8 *)((long)puVar12 + lVar15 + 0x18) = 0x723dac;
        FString::NullString.RefCount = FString::NullString.RefCount + 2;
        *(undefined4 *)((long)puVar12 + lVar15 + 0x20) = 0;
        lVar15 = lVar15 + 0x20;
      } while (uVar18 * 0x20 != lVar15);
      this->Inits = (TexInit *)(puVar12 + 1);
      if (0 < (int)uVar8) {
        lVar19 = 0x10;
        lVar15 = 0;
        do {
          pTVar9 = local_48.Array;
          pTVar5 = this->Inits;
          FString::operator=((FString *)((long)pTVar5 + lVar19 + -0x10),
                             (FString *)((long)local_48.Array + lVar19 + -0x10));
          uVar17 = *(undefined4 *)((long)pTVar9 + lVar19 + -8);
          *(undefined4 *)((long)pTVar5 + lVar19 + -5) = *(undefined4 *)((long)pTVar9 + lVar19 + -5);
          *(undefined4 *)((long)pTVar5 + lVar19 + -8) = uVar17;
          FScriptPosition::operator=
                    ((FScriptPosition *)((long)&(pTVar5->TexName).Chars + lVar19),
                     (FScriptPosition *)((long)&(pTVar9->TexName).Chars + lVar19));
          lVar15 = lVar15 + 1;
          lVar19 = lVar19 + 0x20;
        } while (lVar15 < this->NumParts);
      }
    }
  }
  uVar3 = (this->super_FTexture).Width;
  uVar4 = (this->super_FTexture).Height;
  if (uVar4 == 0 || uVar3 == 0) {
    (this->super_FTexture).UseType = '\r';
    Printf("Texture %s has invalid dimensions (%d, %d)\n",(this->super_FTexture).Name.Chars,
           (ulong)uVar3,(ulong)uVar4);
    (this->super_FTexture).Width = 1;
    (this->super_FTexture).Height = 1;
  }
  FTexture::CalcBitSize(&this->super_FTexture);
  FScanner::SetCMode(sc,false);
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::~TArray(&local_48);
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::~TArray(&local_98);
  return;
}

Assistant:

FMultiPatchTexture::FMultiPatchTexture (FScanner &sc, int usetype)
: Pixels (0), Spans(0), Parts(0), bRedirect(false), bTranslucentPatches(false)
{
	TArray<TexPart> parts;
	TArray<TexInit> inits;
	bool bSilent = false;

	bMultiPatch = true;
	sc.SetCMode(true);
	sc.MustGetString();
	const char* textureName = NULL;
	if (sc.Compare("optional"))
	{
		bSilent = true;
		sc.MustGetString();
		if (sc.Compare(","))
		{
			// this is not right. Apparently a texture named 'optional' is being defined right now...
			sc.UnGet();
			textureName = "optional";
			bSilent = false;
		}
	}
	Name = !textureName ? sc.String : textureName;
	Name.ToUpper();
	sc.MustGetStringName(",");
	sc.MustGetNumber();
	Width = sc.Number;
	sc.MustGetStringName(",");
	sc.MustGetNumber();
	Height = sc.Number;
	UseType = usetype;
	
	if (sc.CheckString("{"))
	{
		while (!sc.CheckString("}"))
		{
			sc.MustGetString();
			if (sc.Compare("XScale"))
			{
				sc.MustGetFloat();
				Scale.X = sc.Float;
				if (Scale.X == 0) sc.ScriptError("Texture %s is defined with null x-scale\n", Name.GetChars());
			}
			else if (sc.Compare("YScale"))
			{
				sc.MustGetFloat();
				Scale.Y = sc.Float;
				if (Scale.Y == 0) sc.ScriptError("Texture %s is defined with null y-scale\n", Name.GetChars());
			}
			else if (sc.Compare("WorldPanning"))
			{
				bWorldPanning = true;
			}
			else if (sc.Compare("NullTexture"))
			{
				UseType = FTexture::TEX_Null;
			}
			else if (sc.Compare("NoDecals"))
			{
				bNoDecals = true;
			}
			else if (sc.Compare("Patch"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_WallPatch;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Sprite"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_Sprite;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Graphic"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_MiscPatch;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Offset"))
			{
				sc.MustGetNumber();
				LeftOffset = sc.Number;
				sc.MustGetStringName(",");
				sc.MustGetNumber();
				TopOffset = sc.Number;
			}
			else
			{
				sc.ScriptError("Unknown texture property '%s'", sc.String);
			}
		}

		NumParts = parts.Size();
		Parts = new TexPart[NumParts];
		memcpy(Parts, &parts[0], NumParts * sizeof(*Parts));
		Inits = new TexInit[NumParts];
		for (int i = 0; i < NumParts; i++)
		{
			Inits[i] = inits[i];
		}
	}
	
	if (Width <= 0 || Height <= 0)
	{
		UseType = FTexture::TEX_Null;
		Printf("Texture %s has invalid dimensions (%d, %d)\n", Name.GetChars(), Width, Height);
		Width = Height = 1;
	}
	CalcBitSize ();

	
	sc.SetCMode(false);
}